

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.cpp
# Opt level: O2

void __thiscall
embree::Points::setBuffer
          (Points *this,RTCBufferType type,uint slot,RTCFormat format,Ref<embree::Buffer> *buffer,
          size_t offset,size_t stride,uint num)

{
  BufferView<embree::Vec3fx> *pBVar1;
  char *pcVar2;
  size_t sVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  undefined8 *puVar7;
  allocator local_59;
  uint local_58;
  uint local_54;
  int w;
  
  local_54 = slot;
  if (type == RTC_BUFFER_TYPE_FLAGS) {
LAB_00257fbf:
    puVar7 = (undefined8 *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&w,"unknown buffer type",&local_59);
    *puVar7 = &PTR__rtcore_error_021d38e0;
    *(undefined4 *)(puVar7 + 1) = 2;
    std::__cxx11::string::string((string *)(puVar7 + 2),(string *)&w);
    __cxa_throw(puVar7,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  local_58 = num;
  iVar5 = (*(buffer->ptr->super_RefCount)._vptr_RefCount[5])();
  uVar4 = local_58;
  if ((((uint)stride | iVar5 + (int)offset) & 3) != 0) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&w,"data must be 4 bytes aligned",&local_59);
    *puVar7 = &PTR__rtcore_error_021d38e0;
    *(undefined4 *)(puVar7 + 1) = 3;
    std::__cxx11::string::string((string *)(puVar7 + 2),(string *)&w);
    __cxa_throw(puVar7,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  if (type == RTC_BUFFER_TYPE_NORMAL) {
    if (*(char *)&(this->super_Geometry).field_8 != '\x1b') {
      puVar7 = (undefined8 *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string((string *)&w,"unknown buffer type",&local_59);
      *puVar7 = &PTR__rtcore_error_021d38e0;
      *(undefined4 *)(puVar7 + 1) = 2;
      std::__cxx11::string::string((string *)(puVar7 + 2),(string *)&w);
      __cxa_throw(puVar7,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
    if (format != RTC_FORMAT_FLOAT3) {
      puVar7 = (undefined8 *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string((string *)&w,"invalid normal buffer format",&local_59);
      *puVar7 = &PTR__rtcore_error_021d38e0;
      *(undefined4 *)(puVar7 + 1) = 3;
      std::__cxx11::string::string((string *)(puVar7 + 2),(string *)&w);
      __cxa_throw(puVar7,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
    if ((this->normals).size_active <= (ulong)local_54) {
      puVar7 = (undefined8 *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string((string *)&w,"invalid normal buffer slot",&local_59);
      *puVar7 = &PTR__rtcore_error_021d38e0;
      *(undefined4 *)(puVar7 + 1) = 3;
      std::__cxx11::string::string((string *)(puVar7 + 2),(string *)&w);
      __cxa_throw(puVar7,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
    RawBufferView::set(&(this->normals).items[local_54].super_RawBufferView,buffer,offset,stride,
                       (ulong)local_58,RTC_FORMAT_FLOAT3);
  }
  else {
    if (type != RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) {
      if (type == RTC_BUFFER_TYPE_VERTEX) {
        if (format != RTC_FORMAT_FLOAT4) {
          puVar7 = (undefined8 *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string((string *)&w,"invalid vertex buffer format",&local_59);
          *puVar7 = &PTR__rtcore_error_021d38e0;
          *(undefined4 *)(puVar7 + 1) = 3;
          std::__cxx11::string::string((string *)(puVar7 + 2),(string *)&w);
          __cxa_throw(puVar7,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
        }
        uVar6 = (ulong)local_54;
        if (uVar6 < (this->vertices).size_active) {
          RawBufferView::set(&(this->vertices).items[uVar6].super_RawBufferView,buffer,offset,stride
                             ,(ulong)local_58,RTC_FORMAT_FLOAT4);
          pBVar1 = (this->vertices).items;
          pcVar2 = pBVar1[uVar6].super_RawBufferView.ptr_ofs;
          sVar3 = pBVar1[uVar6].super_RawBufferView.num;
          if (sVar3 != 0 && pcVar2 != (char *)0x0) {
            w = *(int *)(pcVar2 + (sVar3 - 1) * pBVar1[uVar6].super_RawBufferView.stride + 0xc);
          }
          (*(this->super_Geometry).super_RefCount._vptr_RefCount[4])(this,(ulong)uVar4);
          return;
        }
        puVar7 = (undefined8 *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&w,"invalid vertex buffer slot",&local_59);
        *puVar7 = &PTR__rtcore_error_021d38e0;
        *(undefined4 *)(puVar7 + 1) = 2;
        std::__cxx11::string::string((string *)(puVar7 + 2),(string *)&w);
        __cxa_throw(puVar7,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
      goto LAB_00257fbf;
    }
    if (format + ~RTC_FORMAT_FLOAT16 < 0xfffffff0) {
      puVar7 = (undefined8 *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string((string *)&w,"invalid vertex attribute buffer format",&local_59);
      *puVar7 = &PTR__rtcore_error_021d38e0;
      *(undefined4 *)(puVar7 + 1) = 3;
      std::__cxx11::string::string((string *)(puVar7 + 2),(string *)&w);
      __cxa_throw(puVar7,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
    if ((this->vertexAttribs).size_active <= (ulong)local_54) {
      puVar7 = (undefined8 *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string((string *)&w,"invalid vertex attribute buffer slot",&local_59);
      *puVar7 = &PTR__rtcore_error_021d38e0;
      *(undefined4 *)(puVar7 + 1) = 3;
      std::__cxx11::string::string((string *)(puVar7 + 2),(string *)&w);
      __cxa_throw(puVar7,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
    RawBufferView::set(&(this->vertexAttribs).items[local_54].super_RawBufferView,buffer,offset,
                       stride,(ulong)local_58,format);
  }
  return;
}

Assistant:

void Points::setBuffer(RTCBufferType type,
                         unsigned int slot,
                         RTCFormat format,
                         const Ref<Buffer>& buffer,
                         size_t offset,
                         size_t stride,
                         unsigned int num)
  {
    /* verify that all accesses are 4 bytes aligned */
    if ((type != RTC_BUFFER_TYPE_FLAGS) && (((size_t(buffer->getHostPtr()) + offset) & 0x3) || (stride & 0x3)))
      throw_RTCError(RTC_ERROR_INVALID_OPERATION, "data must be 4 bytes aligned");

    if (type == RTC_BUFFER_TYPE_VERTEX) {
      if (format != RTC_FORMAT_FLOAT4)
        throw_RTCError(RTC_ERROR_INVALID_OPERATION, "invalid vertex buffer format");

      if (slot >= vertices.size())
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid vertex buffer slot");

      vertices[slot].set(buffer, offset, stride, num, format);
      vertices[slot].checkPadding16();
      setNumPrimitives(num);
    } else if (type == RTC_BUFFER_TYPE_NORMAL) {
      if (getType() != GTY_ORIENTED_DISC_POINT)
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "unknown buffer type");

      if (format != RTC_FORMAT_FLOAT3)
        throw_RTCError(RTC_ERROR_INVALID_OPERATION, "invalid normal buffer format");

      if (slot >= normals.size())
        throw_RTCError(RTC_ERROR_INVALID_OPERATION, "invalid normal buffer slot");

      normals[slot].set(buffer, offset, stride, num, format);
      normals[slot].checkPadding16();
    } else if (type == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) {
      if (format < RTC_FORMAT_FLOAT || format > RTC_FORMAT_FLOAT16)
        throw_RTCError(RTC_ERROR_INVALID_OPERATION, "invalid vertex attribute buffer format");

      if (slot >= vertexAttribs.size())
        throw_RTCError(RTC_ERROR_INVALID_OPERATION, "invalid vertex attribute buffer slot");

      vertexAttribs[slot].set(buffer, offset, stride, num, format);
      vertexAttribs[slot].checkPadding16();
    } else
      throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "unknown buffer type");
  }